

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

float nk_scrollbar_behavior
                (nk_flags *state,nk_input *in,int has_scrolling,nk_rect *scroll,nk_rect *cursor,
                nk_rect *empty0,nk_rect *empty1,float scroll_offset,float target,float scroll_step,
                nk_orientation o)

{
  undefined4 uVar1;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined8 uVar2;
  uint uVar5;
  byte bVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  float fVar10;
  float fVar11;
  nk_rect rect;
  float local_b4;
  nk_flags ws;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  undefined8 local_78;
  undefined8 uStack_70;
  nk_rect *local_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  uVar9 = *state & 2 | 4;
  *state = uVar9;
  if (in == (nk_input *)0x0) {
    return scroll_offset;
  }
  local_78 = CONCAT44(local_78._4_4_,(in->mouse).buttons[0].down);
  local_48._0_4_ = cursor->w;
  local_48._4_4_ = cursor->h;
  uStack_40 = 0;
  local_60 = empty0;
  iVar7 = nk_input_has_mouse_click_down_in_rect(in,NK_BUTTON_LEFT,*cursor,1);
  local_58._0_4_ = scroll->x;
  local_58._4_4_ = scroll->y;
  uVar3 = scroll->h;
  uStack_50 = 0;
  local_88 = (float)uVar3;
  fStack_84 = (float)uVar3;
  fStack_80 = (float)uVar3;
  fStack_7c = (float)uVar3;
  iVar8 = nk_input_is_mouse_hovering_rect(in,*scroll);
  if (iVar8 != 0) {
    *state = 0x12;
    uVar9 = 0x12;
  }
  if (((int)local_78 != 0) && (iVar7 != 0)) {
    *state = 0x22;
    if (o == NK_VERTICAL) {
      fVar11 = ((in->mouse).delta.y / local_88) * target + scroll_offset;
      if (target - local_88 <= fVar11) {
        fVar11 = target - local_88;
      }
      local_b4 = 0.0;
      if (0.0 <= fVar11) {
        local_b4 = fVar11;
      }
      (in->mouse).buttons[0].clicked_pos.y =
           local_48._4_4_ * 0.5 + (local_b4 / target) * local_88 + local_58._4_4_;
      uVar9 = 0x22;
    }
    else {
      fVar11 = scroll->w;
      fVar10 = ((in->mouse).delta.x / fVar11) * target + scroll_offset;
      if (target - fVar11 <= fVar10) {
        fVar10 = target - fVar11;
      }
      local_b4 = 0.0;
      if (0.0 <= fVar10) {
        local_b4 = fVar10;
      }
      (in->mouse).buttons[0].clicked_pos.x =
           cursor->w * 0.5 + (local_b4 / target) * fVar11 + scroll->x;
      uVar9 = 0x22;
    }
    goto LAB_0013aa33;
  }
  uVar5 = (in->keyboard).keys[0x1d].clicked;
  bVar6 = 1;
  if ((in->keyboard).keys[0x1d].down == 0) {
    if (uVar5 < 2) goto LAB_0013a88b;
  }
  else if (uVar5 == 0) {
LAB_0013a88b:
    bVar6 = 0;
  }
  fVar11 = local_88;
  if ((bool)(has_scrolling != 0 & o == NK_VERTICAL & bVar6)) {
LAB_0013a8df:
    fVar10 = scroll_offset - fVar11;
    if (scroll_offset - fVar11 <= 0.0) {
      fVar10 = 0.0;
    }
LAB_0013a8e6:
    local_b4 = fVar10;
  }
  else {
    iVar7 = nk_button_behavior(&ws,*local_60,in,NK_BUTTON_DEFAULT);
    if (iVar7 != 0) {
      fVar11 = local_88;
      if (o != NK_VERTICAL) {
        fVar11 = scroll->w;
      }
      goto LAB_0013a8df;
    }
    uVar5 = (in->keyboard).keys[0x1c].clicked;
    if ((in->keyboard).keys[0x1c].down != 0) {
      if ((uVar5 != 0 && has_scrolling != 0) && o == NK_VERTICAL) goto LAB_0013aa10;
LAB_0013a9bf:
      iVar7 = nk_button_behavior(&ws,*empty1,in,NK_BUTTON_DEFAULT);
      if (iVar7 == 0) {
        local_b4 = scroll_offset;
        if (has_scrolling != 0) {
          fVar11 = (in->mouse).scroll_delta;
          if (fVar11 == 0.0) {
            uVar5 = (in->keyboard).keys[0x1a].clicked;
            if ((in->keyboard).keys[0x1a].down == 0) {
              if (1 < uVar5) goto LAB_0013aaff;
            }
            else if (uVar5 != 0) {
LAB_0013aaff:
              local_b4 = scroll_offset;
              if (o == NK_VERTICAL) {
                local_b4 = 0.0;
              }
              goto LAB_0013aa33;
            }
            uVar5 = (in->keyboard).keys[0x1b].clicked;
            if ((in->keyboard).keys[0x1b].down == 0) {
              local_b4 = scroll_offset;
              if (1 < uVar5 && o == NK_VERTICAL) goto LAB_0013ab6a;
            }
            else {
              local_b4 = scroll_offset;
              if (o == NK_VERTICAL && uVar5 != 0) {
LAB_0013ab6a:
                local_b4 = target - local_88;
              }
            }
          }
          else {
            fVar10 = scroll_offset - scroll_step * fVar11;
            fVar11 = local_88;
            if (o != NK_VERTICAL) {
              fVar11 = scroll->w;
            }
            if (target - fVar11 <= fVar10) {
              fVar10 = target - fVar11;
            }
            local_b4 = 0.0;
            if (0.0 <= fVar10) goto LAB_0013a8e6;
          }
        }
        goto LAB_0013aa33;
      }
      if (o == NK_VERTICAL) goto LAB_0013aa10;
      fVar10 = scroll_offset + scroll->w;
      fVar11 = target - scroll->w;
      if (fVar11 <= fVar10) {
        fVar10 = fVar11;
      }
      goto LAB_0013a8e6;
    }
    if ((uVar5 < 2 || o != NK_VERTICAL) || has_scrolling == 0) goto LAB_0013a9bf;
LAB_0013aa10:
    local_b4 = scroll_offset + local_88;
    if (target - local_88 <= scroll_offset + local_88) {
      local_b4 = target - local_88;
    }
  }
LAB_0013aa33:
  uVar1 = scroll->x;
  uVar4 = scroll->y;
  rect.y = (float)uVar4;
  rect.x = (float)uVar1;
  uVar2._0_4_ = scroll->w;
  uVar2._4_4_ = scroll->h;
  if ((uVar9 & 0x10) != 0) {
    uStack_70 = 0;
    local_78 = uVar2;
    iVar7 = nk_input_is_mouse_prev_hovering_rect(in,*scroll);
    uVar2._0_4_ = (int)local_78;
    uVar2._4_4_ = local_78._4_4_;
    if (iVar7 == 0) {
      uVar5 = 8;
      goto LAB_0013aa89;
    }
  }
  rect.h = (float)uVar2._4_4_;
  rect.w = (float)(undefined4)uVar2;
  iVar7 = nk_input_is_mouse_prev_hovering_rect(in,rect);
  if (iVar7 == 0) {
    return local_b4;
  }
  uVar5 = 0x40;
LAB_0013aa89:
  *state = uVar9 | uVar5;
  return local_b4;
}

Assistant:

NK_INTERN float
nk_scrollbar_behavior(nk_flags *state, struct nk_input *in,
    int has_scrolling, const struct nk_rect *scroll,
    const struct nk_rect *cursor, const struct nk_rect *empty0,
    const struct nk_rect *empty1, float scroll_offset,
    float target, float scroll_step, enum nk_orientation o)
{
    nk_flags ws;
    int left_mouse_down;
    int left_mouse_click_in_cursor;

    nk_widget_state_reset(state);
    if (!in) return scroll_offset;

    left_mouse_down = in->mouse.buttons[NK_BUTTON_LEFT].down;
    left_mouse_click_in_cursor = nk_input_has_mouse_click_down_in_rect(in,
        NK_BUTTON_LEFT, *cursor, nk_true);
    if (nk_input_is_mouse_hovering_rect(in, *scroll))
        *state = NK_WIDGET_STATE_HOVERED;

    if (left_mouse_down && left_mouse_click_in_cursor) {
        /* update cursor by mouse dragging */
        float pixel, delta;
        *state = NK_WIDGET_STATE_ACTIVE;
        if (o == NK_VERTICAL) {
            float cursor_y;
            pixel = in->mouse.delta.y;
            delta = (pixel / scroll->h) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->h);
            cursor_y = scroll->y + ((scroll_offset/target) * scroll->h);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.y = cursor_y + cursor->h/2.0f;
        } else {
            float cursor_x;
            pixel = in->mouse.delta.x;
            delta = (pixel / scroll->w) * target;
            scroll_offset = NK_CLAMP(0, scroll_offset + delta, target - scroll->w);
            cursor_x = scroll->x + ((scroll_offset/target) * scroll->w);
            in->mouse.buttons[NK_BUTTON_LEFT].clicked_pos.x = cursor_x + cursor->w/2.0f;
        }
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_UP) && o == NK_VERTICAL && has_scrolling)||
            nk_button_behavior(&ws, *empty0, in, NK_BUTTON_DEFAULT)) {
        /* scroll page up by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MAX(0, scroll_offset - scroll->h);
        else scroll_offset = NK_MAX(0, scroll_offset - scroll->w);
    } else if ((nk_input_is_key_pressed(in, NK_KEY_SCROLL_DOWN) && o == NK_VERTICAL && has_scrolling) ||
        nk_button_behavior(&ws, *empty1, in, NK_BUTTON_DEFAULT)) {
        /* scroll page down by click on empty space or shortcut */
        if (o == NK_VERTICAL)
            scroll_offset = NK_MIN(scroll_offset + scroll->h, target - scroll->h);
        else scroll_offset = NK_MIN(scroll_offset + scroll->w, target - scroll->w);
    } else if (has_scrolling) {
        if ((in->mouse.scroll_delta<0 || (in->mouse.scroll_delta>0))) {
            /* update cursor by mouse scrolling */
            scroll_offset = scroll_offset + scroll_step * (-in->mouse.scroll_delta);
            if (o == NK_VERTICAL)
                scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->h);
            else scroll_offset = NK_CLAMP(0, scroll_offset, target - scroll->w);
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_START)) {
            /* update cursor to the beginning  */
            if (o == NK_VERTICAL) scroll_offset = 0;
        } else if (nk_input_is_key_pressed(in, NK_KEY_SCROLL_END)) {
            /* update cursor to the end */
            if (o == NK_VERTICAL) scroll_offset = target - scroll->h;
        }
    }
    if (*state & NK_WIDGET_STATE_HOVER && !nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_ENTERED;
    else if (nk_input_is_mouse_prev_hovering_rect(in, *scroll))
        *state |= NK_WIDGET_STATE_LEFT;
    return scroll_offset;
}